

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O3

int ndn_name_tlv_encode(ndn_encoder_t *encoder,ndn_name_t *name)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint8_t uVar8;
  uint uVar9;
  ulong uVar10;
  ndn_name_t *component;
  
  iVar2 = -0xe;
  if (encoder->output_max_size != encoder->offset) {
    encoder->output_value[encoder->offset] = '\a';
    uVar4 = encoder->offset + 1;
    encoder->offset = uVar4;
    if ((ulong)name->components_size == 0) {
      uVar3 = 0;
    }
    else {
      lVar7 = 0;
      uVar3 = 0;
      do {
        uVar5 = *(uint *)(name->components[0].value + lVar7 + -4);
        uVar9 = (uint)name->components[0].value[lVar7 + 0x24];
        iVar2 = (uint)(0xffff < uVar5) * 2 + 3;
        if (uVar5 < 0xfd) {
          iVar2 = 1;
        }
        uVar3 = uVar3 + uVar9 + iVar2 + (uint)(0xfc < uVar9) * 2 + 1;
        lVar7 = lVar7 + 0x2c;
      } while ((ulong)name->components_size * 0x2c - lVar7 != 0);
    }
    uVar5 = encoder->output_max_size - uVar4;
    iVar2 = 1;
    if (0xfc < uVar3 || encoder->output_max_size == uVar4) {
      if (uVar3 < 0x10000 && 2 < uVar5) {
        iVar2 = 3;
        iVar1 = 2;
        iVar6 = 1;
        uVar8 = 0xfd;
      }
      else {
        if (uVar5 < 5) {
          return -0xe;
        }
        encoder->output_value[uVar4] = 0xfe;
        encoder->output_value[encoder->offset + 1] = (uint8_t)(uVar3 >> 0x18);
        uVar8 = (uint8_t)(uVar3 >> 0x10);
        uVar4 = encoder->offset + 2;
        iVar2 = 5;
        iVar1 = 4;
        iVar6 = 3;
      }
      encoder->output_value[uVar4] = uVar8;
      encoder->output_value[iVar6 + encoder->offset] = (uint8_t)(uVar3 >> 8);
      uVar4 = iVar1 + encoder->offset;
    }
    encoder->output_value[uVar4] = (uint8_t)uVar3;
    encoder->offset = encoder->offset + iVar2;
    if (name->components_size != '\0') {
      uVar10 = 0;
      component = name;
      do {
        iVar2 = name_component_tlv_encode(encoder,component->components);
        if (iVar2 < 0) {
          return iVar2;
        }
        uVar10 = uVar10 + 1;
        component = (ndn_name_t *)(component->components + 1);
      } while (uVar10 < name->components_size);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static inline int
encoder_append_var(ndn_encoder_t* encoder, uint32_t var)
{
  uint32_t rest_size = encoder->output_max_size - encoder->offset;
  if (var < 253 && rest_size >= 1) {
    encoder->output_value[encoder->offset] = var & 0xFF;
    encoder->offset += 1;
  }
  else if (var <= 0xFFFF && rest_size >= 3) {
    encoder->output_value[encoder->offset] = 253;
    encoder->output_value[encoder->offset + 1] = (var >> 8) & 0xFF;
    encoder->output_value[encoder->offset + 2] = var & 0xFF;
    encoder->offset += 3;
  }
  else if (var <= 0xFFFFFFFF && rest_size >= 5) {
    encoder->output_value[encoder->offset] = 254;
    encoder->output_value[encoder->offset + 1] = (var >> 24) & 0xFF;
    encoder->output_value[encoder->offset + 2] = (var >> 16) & 0xFF;
    encoder->output_value[encoder->offset + 3] = (var >> 8) & 0xFF;
    encoder->output_value[encoder->offset + 4] = var & 0xFF;
    encoder->offset += 5;
  }
  else {
    return NDN_OVERSIZE_VAR;
  }
  return 0;
}